

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlidna.cpp
# Opt level: O2

void qt_punycodeEncoder(QStringView in,QString *output)

{
  char16_t cVar1;
  char32_t cVar2;
  const_iterator pQVar3;
  const_iterator pQVar4;
  const_iterator pQVar5;
  uint uVar6;
  char32_t cVar7;
  uint uVar8;
  char32_t cVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  QChar *pQVar13;
  const_iterator pQVar14;
  long lVar15;
  char16_t *pcVar16;
  bool bVar17;
  uint uVar18;
  ulong extraout_RDX;
  ulong uVar19;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  uint uVar20;
  uint uVar21;
  const_iterator pQVar22;
  long lVar23;
  uint uVar24;
  char *__file;
  int iVar25;
  long in_FS_OFFSET;
  QLatin1StringView str;
  char32_t local_80;
  QStringIterator local_50;
  long local_38;
  
  pQVar22 = (const_iterator)in.m_data;
  lVar23 = in.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (lVar23 < 0x7f) {
    iVar25 = (int)(output->d).size;
    __file = (char *)(long)iVar25;
    QString::resize(output,(qsizetype)(__file + lVar23));
    pQVar13 = QString::data(output);
    pQVar13 = pQVar13 + (long)__file;
    pQVar14 = pQVar22 + lVar23;
    bVar17 = false;
    uVar19 = extraout_RDX;
    for (lVar15 = 0; lVar23 * 2 != lVar15; lVar15 = lVar15 + 2) {
      cVar1 = *(char16_t *)((long)&pQVar22->ucs + lVar15);
      uVar19 = (ulong)(ushort)cVar1;
      if ((ushort)cVar1 < 0x80) {
        pQVar13->ucs = cVar1;
        pQVar13 = pQVar13 + 1;
      }
      else {
        bVar17 = true;
      }
    }
    if (bVar17) {
      pcVar16 = (output->d).ptr;
      if (pcVar16 == (char16_t *)0x0) {
        pcVar16 = L"";
      }
      QString::truncate(output,(char *)((long)pQVar13 - (long)pcVar16 >> 1),uVar19);
      uVar6 = (int)(output->d).size - iVar25;
      if (uVar6 != 0) {
        QString::append(output,(QChar)0x2d);
      }
      uVar20 = 0;
      local_50.i = pQVar22;
      local_50.pos = pQVar22;
      local_50.e = pQVar14;
      do {
        if (local_50.e <= local_50.pos) {
          cVar7 = L'\x80';
          uVar12 = 0x48;
          uVar24 = 0;
          uVar8 = uVar6;
          goto LAB_00245a05;
        }
        uVar20 = uVar20 + 1;
        cVar7 = QStringIterator::next(&local_50,L'\xffffffff');
        uVar19 = extraout_RDX_00;
      } while (cVar7 != L'\xffffffff');
LAB_002459b7:
      QString::truncate(output,__file,uVar19);
    }
  }
LAB_002459c4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
LAB_00245a05:
  if (uVar20 <= uVar8) goto LAB_00245b86;
  local_80 = L'\xffffffff';
  local_50.i = pQVar22;
  local_50.pos = pQVar22;
  local_50.e = pQVar14;
  while (local_50.pos < local_50.e) {
    cVar9 = QStringIterator::nextUnchecked(&local_50);
    cVar2 = local_80;
    if ((uint)cVar9 < (uint)local_80) {
      cVar2 = cVar9;
    }
    if ((uint)cVar7 <= (uint)cVar9) {
      local_80 = cVar2;
    }
  }
  lVar23 = (ulong)(uint)(local_80 - cVar7) * (ulong)(uVar8 + 1);
  uVar18 = (uint)((ulong)lVar23 >> 0x20);
  uVar19 = (ulong)uVar18;
  uVar10 = (uint)lVar23;
  if ((uVar18 != 0) ||
     (uVar18 = uVar24 + uVar10, pQVar3 = pQVar22, pQVar4 = pQVar22, pQVar5 = pQVar14,
     CARRY4(uVar24,uVar10))) goto LAB_002459b7;
  while (local_50.e = pQVar5, local_50.pos = pQVar4, local_50.i = pQVar3, local_50.pos < local_50.e)
  {
    cVar7 = QStringIterator::nextUnchecked(&local_50);
    if (((uint)cVar7 < (uint)local_80) &&
       (uVar18 = uVar18 + 1, uVar19 = extraout_RDX_01, uVar18 == 0)) goto LAB_002459b7;
    pQVar3 = local_50.i;
    pQVar4 = local_50.pos;
    pQVar5 = local_50.e;
    if (cVar7 == local_80) {
      uVar19 = (ulong)uVar18;
      uVar24 = 0x24;
      while( true ) {
        uVar10 = uVar24 - uVar12;
        if (uVar12 + 0x1a <= uVar24) {
          uVar10 = 0x1a;
        }
        if (uVar24 <= uVar12) {
          uVar10 = 1;
        }
        uVar21 = (uint)uVar19;
        if (uVar21 < uVar10) break;
        uVar19 = (ulong)(uVar21 - uVar10) / (ulong)(0x24 - uVar10);
        uVar21 = (uVar21 - uVar10) % (0x24 - uVar10);
        uVar11 = uVar21 + uVar10;
        uVar10 = uVar21 + uVar10 + 0x4b;
        if (0x19 < uVar11) {
          uVar10 = uVar11;
        }
        QString::append(output,(QChar)((short)uVar10 + L'\x16'));
        uVar24 = uVar24 + 0x24;
      }
      uVar12 = uVar21 + 0x4b;
      if (0x19 < uVar21) {
        uVar12 = uVar21;
      }
      QString::append(output,(QChar)((short)uVar12 + L'\x16'));
      uVar12 = adapt(uVar18,uVar8 + 1,uVar8 == uVar6);
      uVar18 = 0;
      pQVar3 = local_50.i;
      pQVar4 = local_50.pos;
      pQVar5 = local_50.e;
      uVar8 = uVar8 + 1;
    }
  }
  uVar24 = uVar18 + 1;
  cVar7 = local_80 + L'\x01';
  goto LAB_00245a05;
LAB_00245b86:
  str.m_data = "xn--";
  str.m_size = 4;
  QString::insert(output,(qsizetype)__file,str);
  goto LAB_002459c4;
}

Assistant:

Q_AUTOTEST_EXPORT void qt_punycodeEncoder(QStringView in, QString *output)
{
    uint n = initial_n;
    uint delta = 0;
    uint bias = initial_bias;

    // Do not try to encode strings that certainly will result in output
    // that is longer than allowable domain name label length. Note that
    // non-BMP codepoints are encoded as two QChars.
    if (in.size() > MaxDomainLabelLength * 2)
        return;

    int outLen = output->size();
    output->resize(outLen + in.size());

    QChar *d = output->data() + outLen;
    bool skipped = false;
    // copy all basic code points verbatim to output.
    for (QChar c : in) {
        if (c.unicode() < 0x80)
            *d++ = c;
        else
            skipped = true;
    }

    // if there were only basic code points, just return them
    // directly; don't do any encoding.
    if (!skipped)
        return;

    output->truncate(d - output->constData());
    int copied = output->size() - outLen;

    // h and b now contain the number of basic code points in input.
    uint b = copied;
    uint h = copied;

    // if basic code points were copied, add the delimiter character.
    if (h > 0)
        *output += u'-';

    // compute the input length in Unicode code points.
    uint inputLength = 0;
    for (QStringIterator iter(in); iter.hasNext();) {
        inputLength++;

        if (iter.next(char32_t(-1)) == char32_t(-1)) {
            output->truncate(outLen);
            return; // invalid surrogate pair
        }
    }

    // while there are still unprocessed non-basic code points left in
    // the input string...
    while (h < inputLength) {
        // find the character in the input string with the lowest unprocessed value.
        uint m = std::numeric_limits<uint>::max();
        for (QStringIterator iter(in); iter.hasNext();) {
            auto c = iter.nextUnchecked();
            static_assert(std::numeric_limits<decltype(m)>::max()
                                  >= std::numeric_limits<decltype(c)>::max(),
                          "Punycode uint should be able to cover all codepoints");
            if (c >= n && c < m)
                m = c;
        }

        // delta = delta + (m - n) * (h + 1), fail on overflow
        uint tmp;
        if (qMulOverflow<uint>(m - n, h + 1, &tmp) || qAddOverflow<uint>(delta, tmp, &delta)) {
            output->truncate(outLen);
            return; // punycode_overflow
        }
        n = m;

        for (QStringIterator iter(in); iter.hasNext();) {
            auto c = iter.nextUnchecked();

            // increase delta until we reach the character processed in this iteration;
            // fail if delta overflows.
            if (c < n) {
                if (qAddOverflow<uint>(delta, 1, &delta)) {
                    output->truncate(outLen);
                    return; // punycode_overflow
                }
            }

            if (c == n) {
                appendEncode(output, delta, bias);

                bias = adapt(delta, h + 1, h == b);
                delta = 0;
                ++h;
            }
        }

        ++delta;
        ++n;
    }

    // prepend ACE prefix
    output->insert(outLen, "xn--"_L1);
    return;
}